

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing.cpp
# Opt level: O0

tracer_unique_ptr_t so_5::msg_tracing::std_cout_tracer(void)

{
  std_stream_tracer_t *this;
  __uniq_ptr_data<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>,_true,_true>
  in_RDI;
  
  this = (std_stream_tracer_t *)operator_new(0x38);
  impl::std_stream_tracer_t::std_stream_tracer_t(this,(ostream *)&std::cout);
  std::unique_ptr<so_5::msg_tracing::tracer_t,std::default_delete<so_5::msg_tracing::tracer_t>>::
  unique_ptr<std::default_delete<so_5::msg_tracing::tracer_t>,void>
            ((unique_ptr<so_5::msg_tracing::tracer_t,std::default_delete<so_5::msg_tracing::tracer_t>>
              *)in_RDI.
                super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
                ._M_t.
                super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
                .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl,
             (pointer)this);
  return (__uniq_ptr_data<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>,_true,_true>
          )(tuple<so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>)
           in_RDI.
           super___uniq_ptr_impl<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_so_5::msg_tracing::tracer_t_*,_std::default_delete<so_5::msg_tracing::tracer_t>_>
           .super__Head_base<0UL,_so_5::msg_tracing::tracer_t_*,_false>._M_head_impl;
}

Assistant:

SO_5_FUNC tracer_unique_ptr_t
std_cout_tracer()
	{
		return tracer_unique_ptr_t{ new impl::std_stream_tracer_t{ std::cout } };
	}